

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O0

JSONNode * __thiscall jsonChildren::operator[](jsonChildren *this,json_index_t position)

{
  JSONNode **ppJVar1;
  bool bVar2;
  allocator local_c1;
  json_string local_c0;
  allocator local_99;
  json_string local_98;
  allocator local_71;
  json_string local_70;
  allocator local_39;
  json_string local_38;
  json_index_t local_14;
  jsonChildren *pjStack_10;
  json_index_t position_local;
  jsonChildren *this_local;
  
  local_14 = position;
  pjStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Children is null []",&local_39);
  JSONDebug::_JSON_ASSERT(this != (jsonChildren *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar2 = local_14 < this->mysize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"Using [] out of bounds",&local_71);
  JSONDebug::_JSON_ASSERT(bVar2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  bVar2 = local_14 < this->mycapacity;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"Using [] out of bounds",&local_99);
  JSONDebug::_JSON_ASSERT(bVar2,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  ppJVar1 = this->array;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"Array is null",&local_c1);
  JSONDebug::_JSON_ASSERT(ppJVar1 != (JSONNode **)0x0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  return this->array[local_14];
}

Assistant:

inline JSONNode * operator[] (json_index_t position) const json_nothrow {
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null []"));
	   JSON_ASSERT(position < mysize, JSON_TEXT("Using [] out of bounds"));
	   JSON_ASSERT(position < mycapacity, JSON_TEXT("Using [] out of bounds"));
	   JSON_ASSERT(array != 0, JSON_TEXT("Array is null"));
	   return array[position];
    }